

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O1

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::
make_uniq_base<duckdb::Expression,duckdb::BoundComparisonExpression,duckdb::ExpressionType,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::BoundConstantExpression,std::default_delete<duckdb::BoundConstantExpression>,true>>
          (duckdb *this,ExpressionType *args,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *args_1,
          unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
          *args_2)

{
  ExpressionType type;
  BoundComparisonExpression *this_00;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::BoundConstantExpression_*,_false> local_38;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_30;
  
  this_00 = (BoundComparisonExpression *)operator_new(0x68);
  type = *args;
  local_30._M_head_impl =
       (args_1->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
       .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (args_1->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  local_38._M_head_impl =
       (args_2->
       super_unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>_>
       )._M_t.
       super___uniq_ptr_impl<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::BoundConstantExpression_*,_std::default_delete<duckdb::BoundConstantExpression>_>
       .super__Head_base<0UL,_duckdb::BoundConstantExpression_*,_false>._M_head_impl;
  (args_2->
  super_unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>_>
  )._M_t.
  super___uniq_ptr_impl<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundConstantExpression_*,_std::default_delete<duckdb::BoundConstantExpression>_>
  .super__Head_base<0UL,_duckdb::BoundConstantExpression_*,_false>._M_head_impl =
       (BoundConstantExpression *)0x0;
  BoundComparisonExpression::BoundComparisonExpression
            (this_00,type,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_30,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_38);
  *(BoundComparisonExpression **)this = this_00;
  if (local_38._M_head_impl != (BoundConstantExpression *)0x0) {
    (*((local_38._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])();
  }
  local_38._M_head_impl = (BoundConstantExpression *)0x0;
  if (local_30._M_head_impl != (Expression *)0x0) {
    (*((local_30._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<S> make_uniq_base(ARGS &&... args) { // NOLINT: mimic std style
	return unique_ptr<S>(new T(std::forward<ARGS>(args)...));
}